

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O1

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,MemorySpace value)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 1) {
    pcVar2 = "MemorySpace::Host";
    pcVar1 = "";
  }
  else if ((int)this == 0) {
    pcVar2 = "MemorySpace::Detect";
    pcVar1 = "";
  }
  else {
    pcVar2 = "ToString: Unknown MemorySpace";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(MemorySpace value)
{
    switch (value)
    {
    case MemorySpace::Detect:
        return "MemorySpace::Detect";
    case MemorySpace::Host:
        return "MemorySpace::Host";
#ifdef ADIOS2_HAVE_GPU_SUPPORT
    case MemorySpace::GPU:
        return "MemorySpace::GPU";
#endif
    default:
        return "ToString: Unknown MemorySpace";
    }
}